

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cshutdn.c
# Opt level: O0

size_t Curl_cshutdn_dest_count(Curl_easy *data,char *destination)

{
  int iVar1;
  void *pvVar2;
  connectdata *conn;
  Curl_llist_node *e;
  size_t n;
  cshutdn *csd;
  char *destination_local;
  Curl_easy *data_local;
  
  if ((data == (Curl_easy *)0x0) || (data->multi == (Curl_multi *)0x0)) {
    data_local = (Curl_easy *)0x0;
  }
  else {
    e = (Curl_llist_node *)0x0;
    for (conn = (connectdata *)Curl_llist_head(&(data->multi->cshutdn).list);
        conn != (connectdata *)0x0; conn = (connectdata *)Curl_node_next(&conn->cpool_node)) {
      pvVar2 = Curl_node_elem(&conn->cpool_node);
      iVar1 = strcmp(destination,*(char **)((long)pvVar2 + 0x58));
      if (iVar1 == 0) {
        e = (Curl_llist_node *)((long)&e->_list + 1);
      }
    }
    data_local = (Curl_easy *)e;
  }
  return (size_t)data_local;
}

Assistant:

size_t Curl_cshutdn_dest_count(struct Curl_easy *data,
                               const char *destination)
{
  if(data && data->multi) {
    struct cshutdn *csd = &data->multi->cshutdn;
    size_t n = 0;
    struct Curl_llist_node *e = Curl_llist_head(&csd->list);
    while(e) {
      struct connectdata *conn = Curl_node_elem(e);
      if(!strcmp(destination, conn->destination))
        ++n;
      e = Curl_node_next(e);
    }
    return n;
  }
  return 0;
}